

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace<ncnn::BinaryOp_x86_avx512_functor::binary_op_min>
              (Mat *a,float b,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long *in_RDI;
  uint in_XMM0_Da;
  float fVar3;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar4 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  __m128 afVar13;
  __m128 _p_2;
  __m128 _b;
  __m256 _p_1;
  __m256 _b_avx;
  __m512 _p;
  __m512 _b_avx512;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_min op;
  Mat *m;
  __m256 *in_stack_fffffffffffffb40;
  binary_op_min *in_stack_fffffffffffffb48;
  binary_op_min *in_stack_fffffffffffffb50;
  __m512 *in_stack_fffffffffffffb60;
  __m512 *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  uint in_stack_fffffffffffffb74;
  float local_460 [2];
  float afStack_458 [2];
  float local_450 [4];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  int local_344;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined4 local_328;
  long local_320;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined8 local_300;
  float *local_2f8;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  binary_op_min local_2d1 [13];
  uint local_2c4;
  long *local_2c0;
  undefined8 *local_2b8;
  undefined1 local_2ad;
  int local_2ac;
  undefined8 *local_2a0;
  undefined8 *local_290;
  float *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  float *local_208;
  undefined1 local_200 [64];
  uint local_1ac;
  float *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  float *local_170;
  float *local_168;
  float local_160 [2];
  float afStack_158 [4];
  float *local_148;
  long local_140;
  undefined4 local_134;
  long local_130;
  float *local_128;
  undefined4 local_11c;
  int local_118;
  int local_114;
  undefined8 *local_110;
  undefined4 local_104;
  long local_100;
  undefined8 *local_e0;
  uint local_c4;
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint local_a4;
  undefined1 local_a0 [32];
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  
  local_2d8 = *(int *)((long)in_RDI + 0x2c);
  local_2dc = (int)in_RDI[6];
  local_2e0 = *(int *)((long)in_RDI + 0x34);
  local_2e4 = (int)in_RDI[7];
  local_2e8 = (int)in_RDI[3];
  local_2ec = local_2d8 * local_2dc * local_2e0 * local_2e8;
  local_2c4 = in_XMM0_Da;
  local_2c0 = in_RDI;
  for (local_2f0 = 0; local_2f0 < local_2e4; local_2f0 = local_2f0 + 1) {
    local_2a0 = &local_340;
    local_114 = *(int *)((long)local_2c0 + 0x2c);
    local_118 = (int)local_2c0[6];
    local_11c = *(undefined4 *)((long)local_2c0 + 0x34);
    local_2f8 = (float *)(*local_2c0 + local_2c0[8] * (long)local_2f0 * local_2c0[2]);
    local_130 = local_2c0[2];
    local_134 = (undefined4)local_2c0[3];
    local_140 = local_2c0[4];
    local_110 = &local_340;
    local_100 = (long)local_114 * (long)local_118 * local_130;
    local_290 = &local_340;
    local_2b8 = &local_340;
    local_104 = 0x10;
    local_2ac = local_2f0;
    local_2ad = 1;
    local_340 = 0;
    local_330 = 0;
    local_328 = 0;
    local_318 = 0;
    local_314 = 0;
    local_310 = 0;
    local_30c = 0;
    local_308 = 0;
    local_300 = 0;
    local_338 = 0;
    local_344 = 0;
    local_1ac = local_2c4;
    local_200 = vbroadcastss_avx512f(ZEXT416(local_2c4));
    local_3c0 = local_200._0_8_;
    uStack_3b8 = local_200._8_8_;
    uStack_3b0 = local_200._16_8_;
    uStack_3a8 = local_200._24_8_;
    uStack_3a0 = local_200._32_8_;
    uStack_398 = local_200._40_8_;
    uStack_390 = local_200._48_8_;
    uStack_388 = local_200._56_8_;
    local_128 = local_2f8;
    local_e0 = local_2b8;
    local_320 = local_140;
    for (; local_344 + 0xf < local_2ec; local_344 = local_344 + 0x10) {
      local_288 = local_2f8;
      uVar6 = *(undefined8 *)local_2f8;
      uVar5 = *(undefined8 *)(local_2f8 + 2);
      uVar7 = *(undefined8 *)(local_2f8 + 4);
      uVar8 = *(undefined8 *)(local_2f8 + 6);
      uVar9 = *(undefined8 *)(local_2f8 + 8);
      uVar10 = *(undefined8 *)(local_2f8 + 10);
      uVar11 = *(undefined8 *)(local_2f8 + 0xc);
      uVar12 = *(undefined8 *)(local_2f8 + 0xe);
      local_400 = uVar6;
      uStack_3f8 = uVar5;
      uStack_3f0 = uVar7;
      uStack_3e8 = uVar8;
      uStack_3e0 = uVar9;
      uStack_3d8 = uVar10;
      uStack_3d0 = uVar11;
      uStack_3c8 = uVar12;
      BinaryOp_x86_avx512_functor::binary_op_min::func_pack16
                ((binary_op_min *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      local_208 = local_2f8;
      *(undefined8 *)local_2f8 = uVar6;
      *(undefined8 *)(local_2f8 + 2) = uVar5;
      *(undefined8 *)(local_2f8 + 4) = uVar7;
      *(undefined8 *)(local_2f8 + 6) = uVar8;
      *(undefined8 *)(local_2f8 + 8) = uVar9;
      *(undefined8 *)(local_2f8 + 10) = uVar10;
      *(undefined8 *)(local_2f8 + 0xc) = uVar11;
      *(undefined8 *)(local_2f8 + 0xe) = uVar12;
      local_2f8 = local_2f8 + 0x10;
      local_400 = uVar6;
      uStack_3f8 = uVar5;
      uStack_3f0 = uVar7;
      uStack_3e8 = uVar8;
      uStack_3e0 = uVar9;
      uStack_3d8 = uVar10;
      uStack_3d0 = uVar11;
      uStack_3c8 = uVar12;
      local_280 = uVar6;
      uStack_278 = uVar5;
      uStack_270 = uVar7;
      uStack_268 = uVar8;
      uStack_260 = uVar9;
      uStack_258 = uVar10;
      uStack_250 = uVar11;
      uStack_248 = uVar12;
    }
    local_c4 = local_2c4;
    local_54 = local_2c4;
    local_58 = local_2c4;
    local_5c = local_2c4;
    local_60 = local_2c4;
    local_64 = local_2c4;
    local_68 = local_2c4;
    local_6c = local_2c4;
    local_70 = local_2c4;
    auVar1 = vinsertps_avx(ZEXT416(local_2c4),ZEXT416(local_2c4),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_2c4),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_2c4),0x30);
    auVar2 = vinsertps_avx(ZEXT416(local_2c4),ZEXT416(local_2c4),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_2c4),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_2c4),0x30);
    auVar4._16_16_ = auVar1;
    auVar4._0_16_ = auVar2;
    local_a0._0_8_ = auVar2._0_8_;
    local_a0._8_8_ = auVar2._8_8_;
    local_a0._16_8_ = auVar1._0_8_;
    local_a0._24_8_ = auVar1._8_8_;
    local_420 = local_a0._0_8_;
    uStack_418 = local_a0._8_8_;
    uStack_410 = local_a0._16_8_;
    uStack_408 = local_a0._24_8_;
    in_stack_fffffffffffffb74 = local_2c4;
    local_a0 = auVar4;
    for (; local_344 + 7 < local_2ec; local_344 = local_344 + 8) {
      local_1a8 = local_2f8;
      uVar6 = *(undefined8 *)local_2f8;
      uVar5 = *(undefined8 *)(local_2f8 + 2);
      uVar7 = *(undefined8 *)(local_2f8 + 4);
      uVar8 = *(undefined8 *)(local_2f8 + 6);
      local_440 = uVar6;
      uStack_438 = uVar5;
      uStack_430 = uVar7;
      uStack_428 = uVar8;
      BinaryOp_x86_avx512_functor::binary_op_min::func_pack8
                (in_stack_fffffffffffffb50,(__m256 *)in_stack_fffffffffffffb48,
                 in_stack_fffffffffffffb40);
      local_170 = local_2f8;
      *(undefined8 *)local_2f8 = uVar6;
      *(undefined8 *)(local_2f8 + 2) = uVar5;
      *(undefined8 *)(local_2f8 + 4) = uVar7;
      *(undefined8 *)(local_2f8 + 6) = uVar8;
      local_2f8 = local_2f8 + 8;
      local_440 = uVar6;
      uStack_438 = uVar5;
      uStack_430 = uVar7;
      uStack_428 = uVar8;
      local_1a0 = uVar6;
      uStack_198 = uVar5;
      uStack_190 = uVar7;
      uStack_188 = uVar8;
    }
    local_a4 = local_2c4;
    local_c0 = local_2c4;
    uStack_bc = local_2c4;
    uStack_b8 = local_2c4;
    uStack_b4 = local_2c4;
    for (; local_344 + 3 < local_2ec; local_344 = local_344 + 4) {
      local_168 = local_2f8;
      local_460 = *(float (*) [2])local_2f8;
      uVar6 = *(undefined8 *)(local_2f8 + 2);
      afStack_458 = (float  [2])uVar6;
      afVar13 = BinaryOp_x86_avx512_functor::binary_op_min::func_pack4
                          (local_2d1,(__m128 *)local_460,&local_450);
      local_460 = afVar13._0_8_;
      local_148 = local_2f8;
      *(float (*) [2])local_2f8 = local_460;
      *(undefined8 *)(local_2f8 + 2) = uVar6;
      local_2f8 = local_2f8 + 4;
      afStack_458 = (float  [2])uVar6;
      local_160 = local_460;
      afStack_158._0_8_ = uVar6;
    }
    for (; local_344 < local_2ec; local_344 = local_344 + 1) {
      fVar3 = BinaryOp_x86_avx512_functor::binary_op_min::func
                        (in_stack_fffffffffffffb48,*in_stack_fffffffffffffb40,(float *)0x153b086);
      *local_2f8 = fVar3;
      local_2f8 = local_2f8 + 1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace(Mat& a, float b, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b_avx512 = _mm512_set1_ps(b);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p, _b_avx512);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _b_avx = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p, _b_avx);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _b = _mm_set1_ps((float)b);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p, _b);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr, b);
            ptr++;
        }
    }

    return 0;
}